

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_14174cb::SADSkipx4Test_MaxRef_Test::~SADSkipx4Test_MaxRef_Test
          (SADSkipx4Test_MaxRef_Test *this)

{
  void *in_RDI;
  
  ~SADSkipx4Test_MaxRef_Test((SADSkipx4Test_MaxRef_Test *)0xc3b8b8);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST_P(SADSkipx4Test, MaxRef) {
  FillConstant(source_data_, source_stride_, 0);
  FillConstant(GetReference(0), reference_stride_, mask_);
  FillConstant(GetReference(1), reference_stride_, mask_);
  FillConstant(GetReference(2), reference_stride_, mask_);
  FillConstant(GetReference(3), reference_stride_, mask_);
  CheckSADs();
}